

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_partial_forceExtDict
              (char *source,char *dest,int compressedSize,int targetOutputSize,int dstCapacity,
              void *dictStart,size_t dictSize)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  undefined8 uVar5;
  ushort uVar6;
  ushort uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ushort *puVar11;
  ushort *__src;
  ushort *puVar12;
  size_t __n;
  BYTE *d_1;
  char *pcVar13;
  char *pcVar14;
  int iVar15;
  BYTE *d;
  char *pcVar16;
  char *__dest;
  ulong __n_00;
  ulong uVar17;
  BYTE *s;
  int local_78;
  
  if (targetOutputSize < dstCapacity) {
    dstCapacity = targetOutputSize;
  }
  iVar15 = -1;
  if (-1 < dstCapacity && source != (char *)0x0) {
    lVar8 = (long)dictStart + dictSize;
    if (dictStart == (void *)0x0) {
      lVar8 = 0;
    }
    if (dstCapacity == 0) {
      iVar15 = 0;
    }
    else if (compressedSize != 0) {
      pbVar1 = (byte *)(source + compressedSize);
      pcVar13 = dest + (uint)dstCapacity;
      __dest = dest;
      puVar12 = (ushort *)source;
LAB_002aa6e7:
      __src = (ushort *)((long)puVar12 + 1);
      bVar2 = (byte)*puVar12;
      uVar10 = (ulong)(uint)(bVar2 >> 4);
      if (bVar2 >> 4 == 0xf) {
        if (pbVar1 + -0xf <= __src) goto LAB_002aaac9;
        puVar12 = puVar12 + 1;
        lVar9 = 0;
        puVar11 = __src;
        do {
          __src = (ushort *)((long)puVar11 + 1);
          if (pbVar1 + -0xf < __src) goto LAB_002aaac9;
          uVar6 = *puVar11;
          lVar9 = lVar9 + (ulong)(byte)uVar6;
          puVar12 = (ushort *)((long)puVar12 + 1);
          puVar11 = __src;
        } while ((ulong)(byte)uVar6 == 0xff);
        if (((lVar9 == -1) || (uVar10 = lVar9 + 0xf, CARRY8((ulong)__dest,uVar10))) ||
           ((ulong)-(long)puVar12 < uVar10)) goto LAB_002aaac9;
LAB_002aa758:
        pcVar16 = __dest + uVar10;
        if ((pcVar13 + -0xc < pcVar16) ||
           (puVar12 = (ushort *)((long)__src + uVar10), pbVar1 + -8 < puVar12)) {
          pcVar14 = pcVar16;
          if (pbVar1 < (byte *)((long)__src + uVar10)) {
            pcVar14 = __dest + ((long)pbVar1 - (long)__src);
            uVar10 = (long)pbVar1 - (long)__src;
          }
          __n = (long)pcVar13 - (long)__dest;
          if (pcVar14 <= pcVar13) {
            __n = uVar10;
          }
          memmove(__dest,__src,__n);
          pcVar16 = __dest + __n;
          if ((pcVar13 <= pcVar14) ||
             (puVar12 = (ushort *)((long)__src + __n), pbVar1 + -2 <= puVar12)) goto LAB_002aaabe;
        }
        else {
          do {
            *(undefined8 *)__dest = *(undefined8 *)__src;
            __dest = __dest + 8;
            __src = __src + 4;
          } while (__dest < pcVar16);
        }
        uVar6 = *puVar12;
        __src = puVar12 + 1;
        pcVar14 = pcVar16 + -(ulong)uVar6;
        uVar17 = (ulong)(bVar2 & 0xf);
      }
      else {
        if ((source + (long)compressedSize + -0x10 <= __src) ||
           (dest + ((ulong)(uint)dstCapacity - 0x20) < __dest)) goto LAB_002aa758;
        uVar5 = *(undefined8 *)((long)puVar12 + 9);
        *(undefined8 *)__dest = *(undefined8 *)__src;
        *(undefined8 *)(__dest + 8) = uVar5;
        pcVar16 = __dest + uVar10;
        uVar17 = (ulong)(bVar2 & 0xf);
        puVar12 = (ushort *)((long)__src + uVar10);
        __src = puVar12 + 1;
        uVar6 = *puVar12;
        pcVar14 = pcVar16 + -(ulong)uVar6;
        if (((uVar17 != 0xf) && (7 < uVar6)) && (dest <= pcVar14)) {
          *(undefined8 *)pcVar16 = *(undefined8 *)pcVar14;
          *(undefined8 *)(pcVar16 + 8) = *(undefined8 *)(pcVar14 + 8);
          *(undefined2 *)(pcVar16 + 0x10) = *(undefined2 *)(pcVar14 + 0x10);
          __dest = pcVar16 + uVar17 + 4;
          puVar12 = __src;
          goto LAB_002aa6e7;
        }
      }
      if ((int)uVar17 == 0xf) {
        lVar9 = 0;
        puVar12 = __src;
        do {
          __src = (ushort *)((long)puVar12 + 1);
          if (pbVar1 + -4 < __src) goto LAB_002aaac9;
          uVar7 = *puVar12;
          lVar9 = lVar9 + (ulong)(byte)uVar7;
          puVar12 = __src;
        } while ((ulong)(byte)uVar7 == 0xff);
        uVar17 = lVar9 + 0xf;
        if ((lVar9 == -1) || (CARRY8((ulong)pcVar16,uVar17))) goto LAB_002aaac9;
      }
      if ((dictSize < 0x10000) && (pcVar14 + dictSize < dest)) {
LAB_002aaac9:
        local_78 = (int)source;
        return ~(uint)__src + local_78;
      }
      uVar17 = uVar17 + 4;
      __dest = pcVar16 + uVar17;
      puVar12 = __src;
      if (pcVar14 < dest) {
        if ((pcVar13 + -5 < __dest) && ((ulong)((long)pcVar13 - (long)pcVar16) <= uVar17)) {
          uVar17 = (long)pcVar13 - (long)pcVar16;
        }
        __n_00 = (long)dest - (long)pcVar14;
        uVar10 = uVar17 - __n_00;
        if (uVar17 < __n_00 || uVar10 == 0) {
          memmove(pcVar16,(void *)(lVar8 - __n_00),uVar17);
          __dest = pcVar16 + uVar17;
        }
        else {
          memcpy(pcVar16,(void *)(lVar8 - __n_00),__n_00);
          __dest = pcVar16 + __n_00;
          if ((ulong)((long)__dest - (long)dest) < uVar10) {
            pcVar14 = dest;
            for (; __dest < pcVar16 + uVar17; __dest = __dest + 1) {
              cVar3 = *pcVar14;
              pcVar14 = pcVar14 + 1;
              *__dest = cVar3;
            }
          }
          else {
            memcpy(__dest,dest,uVar10);
            __dest = pcVar16 + uVar17;
          }
        }
        goto LAB_002aa6e7;
      }
      if (__dest <= pcVar13 + -0xc) {
        if (uVar6 < 8) {
          pcVar16[0] = '\0';
          pcVar16[1] = '\0';
          pcVar16[2] = '\0';
          pcVar16[3] = '\0';
          *pcVar16 = *pcVar14;
          pcVar16[1] = pcVar14[1];
          pcVar16[2] = pcVar14[2];
          pcVar16[3] = pcVar14[3];
          uVar4 = inc32table[uVar6];
          *(undefined4 *)(pcVar16 + 4) = *(undefined4 *)(pcVar14 + uVar4);
          pcVar14 = pcVar14 + ((ulong)uVar4 - (long)dec64table[uVar6]);
        }
        else {
          *(undefined8 *)pcVar16 = *(undefined8 *)pcVar14;
          pcVar14 = pcVar14 + 8;
        }
        *(undefined8 *)(pcVar16 + 8) = *(undefined8 *)pcVar14;
        if (0x10 < uVar17) {
          pcVar16 = pcVar16 + 0x10;
          do {
            pcVar14 = pcVar14 + 8;
            *(undefined8 *)pcVar16 = *(undefined8 *)pcVar14;
            pcVar16 = pcVar16 + 8;
          } while (pcVar16 < __dest);
        }
        goto LAB_002aa6e7;
      }
      uVar10 = (long)pcVar13 - (long)pcVar16;
      if (uVar17 < (ulong)((long)pcVar13 - (long)pcVar16)) {
        uVar10 = uVar17;
      }
      __dest = pcVar16 + uVar10;
      if (pcVar16 < pcVar14 + uVar10) {
        for (; pcVar16 < __dest; pcVar16 = pcVar16 + 1) {
          cVar3 = *pcVar14;
          pcVar14 = pcVar14 + 1;
          *pcVar16 = cVar3;
        }
      }
      else {
        memcpy(pcVar16,pcVar14,uVar10);
      }
      pcVar16 = pcVar13;
      if (__dest != pcVar13) goto LAB_002aa6e7;
LAB_002aaabe:
      iVar15 = (int)pcVar16 - (int)dest;
    }
  }
  return iVar15;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_partial_forceExtDict(const char* source, char* dest,
                                     int compressedSize, int targetOutputSize, int dstCapacity,
                                     const void* dictStart, size_t dictSize)
{
    dstCapacity = MIN(targetOutputSize, dstCapacity);
    return LZ4_decompress_generic(source, dest, compressedSize, dstCapacity,
                                  partial_decode, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}